

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O3

bool __thiscall
TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
processArg(ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pbVar4;
  Visitor *pVVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  CmdLineParseException *this_00;
  ArgParseException *pAVar10;
  ulong uVar11;
  string *val;
  string flag;
  string value;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  if (((this->super_Arg)._ignoreable != true) || (Arg::ignoreRestRef()::ign == '\0')) {
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = pbVar2 + *i;
    uVar9 = pbVar2[*i]._M_string_length;
    if (uVar9 < 2) {
LAB_0010fa75:
      local_70[0] = local_60;
      pcVar3 = (pbVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_70,pcVar3,pcVar3 + uVar9);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      val = &local_50;
      (*(this->super_Arg)._vptr_Arg[10])(this,local_70,val);
      iVar8 = (*(this->super_Arg)._vptr_Arg[6])(this,local_70);
      cVar7 = (char)iVar8;
      if (cVar7 != '\0') {
        if ((this->super_Arg)._alreadySet == true) {
          bVar1 = (this->super_Arg)._xorSet;
          this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          if (bVar1 != true) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"Argument already set!","");
            (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
            CmdLineParseException::CmdLineParseException(this_00,&local_b0,&local_90);
            __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
          }
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Mutually exclusive argument already set!","");
          (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
          CmdLineParseException::CmdLineParseException(this_00,&local_b0,&local_90);
          __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
        }
        if ((Arg::delimiterRef()::delim != ' ') &&
           (iVar8 = std::__cxx11::string::compare((char *)&local_50), iVar8 == 0)) {
          pAVar10 = (ArgParseException *)__cxa_allocate_exception(0x68);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Couldn\'t find delimiter for this argument!","");
          (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
          ArgParseException::ArgParseException(pAVar10,&local_b0,&local_90);
          __cxa_throw(pAVar10,&ArgParseException::typeinfo,ArgException::~ArgException);
        }
        iVar8 = std::__cxx11::string::compare((char *)val);
        if (iVar8 == 0) {
          uVar9 = (long)*i + 1;
          *i = (int)uVar9;
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <=
              (uVar9 & 0xffffffff)) {
            pAVar10 = (ArgParseException *)__cxa_allocate_exception(0x68);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"Missing a value for this argument!","");
            (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
            ArgParseException::ArgParseException(pAVar10,&local_b0,&local_90);
            __cxa_throw(pAVar10,&ArgParseException::typeinfo,ArgException::~ArgException);
          }
          val = pbVar4 + uVar9;
        }
        _extractValue(this,val);
        (this->super_Arg)._alreadySet = true;
        pVVar5 = (this->super_Arg)._visitor;
        if (pVVar5 != (Visitor *)0x0) {
          (*pVVar5->_vptr_Visitor[2])();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_70[0] == local_60) {
        return (bool)cVar7;
      }
      operator_delete(local_70[0]);
      return (bool)cVar7;
    }
    pcVar3 = (pbVar4->_M_dataplus)._M_p;
    if (pcVar3[1] != '\a') {
      uVar6 = 2;
      do {
        uVar11 = uVar6;
        if (uVar9 == uVar11) break;
        uVar6 = uVar11 + 1;
      } while (pcVar3[uVar11] != '\a');
      if (uVar9 <= uVar11) goto LAB_0010fa75;
    }
  }
  return false;
}

Assistant:

bool ValueArg<T>::processArg(int *i, std::vector<std::string>& args)
{
    if ( _ignoreable && Arg::ignoreRest() )
		return false;

    if ( _hasBlanks( args[*i] ) )
		return false;

    std::string flag = args[*i];

    std::string value = "";
    trimFlag( flag, value );

    if ( argMatches( flag ) )
    {
        if ( _alreadySet )
		{
			if ( _xorSet )
				throw( CmdLineParseException(
				       "Mutually exclusive argument already set!", 
				                             toString()) );
			else
				throw( CmdLineParseException("Argument already set!", 
				                             toString()) );
		}

        if ( Arg::delimiter() != ' ' && value == "" )
			throw( ArgParseException( 
							"Couldn't find delimiter for this argument!",
                             toString() ) );

        if ( value == "" )
        {
            (*i)++;
            if ( static_cast<unsigned int>(*i) < args.size() ) 
				_extractValue( args[*i] );
            else
				throw( ArgParseException("Missing a value for this argument!",
                                                    toString() ) );
        }
        else
			_extractValue( value );
				
        _alreadySet = true;
        _checkWithVisitor();
        return true;
    }	
    else
		return false;
}